

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckComments.cxx
# Opt level: O1

bool __thiscall
kws::Parser::CheckComments
          (Parser *this,char *begin,char *middle,char *end,bool allowEmptyLineBeforeClass,
          bool checkWrongComment,bool checkMissingComment)

{
  string *psVar1;
  char cVar2;
  char *pcVar3;
  size_type sVar4;
  pointer pcVar5;
  bool bVar6;
  int iVar7;
  size_t sVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  ulong uVar9;
  long lVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  byte bVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  bool bVar17;
  pointer ppVar18;
  size_type sVar19;
  string word;
  string sub;
  value_type local_100;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 local_b8 [20];
  undefined4 local_a4;
  undefined8 local_a0;
  size_t local_98;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  local_a4 = (undefined4)CONCAT71(in_register_00000081,allowEmptyLineBeforeClass);
  if (CONCAT31(in_register_00000089,checkWrongComment) != 0) {
    this->m_TestsDone[0x13] = true;
    std::__cxx11::string::_M_replace
              ((ulong)(this->m_TestsDescription + 0x13),0,
               (char *)this->m_TestsDescription[0x13]._M_string_length,0x178876);
    pcVar3 = (char *)(this->m_CommentBegin)._M_string_length;
    strlen(begin);
    std::__cxx11::string::_M_replace((ulong)&this->m_CommentBegin,0,pcVar3,(ulong)begin);
    pcVar3 = (char *)(this->m_CommentMiddle)._M_string_length;
    strlen(middle);
    std::__cxx11::string::_M_replace((ulong)&this->m_CommentMiddle,0,pcVar3,(ulong)middle);
    pcVar3 = (char *)(this->m_CommentEnd)._M_string_length;
    strlen(end);
    std::__cxx11::string::_M_replace((ulong)&this->m_CommentEnd,0,pcVar3,(ulong)end);
    ppVar18 = (this->m_CommentPositions).
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppVar18 !=
        (this->m_CommentPositions).
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_100.line = (unsigned_long)&local_100.number;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_100);
        uVar13 = ppVar18->first;
        while ((uVar15 = (this->m_Buffer)._M_string_length, uVar13 < uVar15 &&
               (uVar9 = ppVar18->second, uVar13 < uVar9))) {
          uVar14 = uVar13;
          if (uVar13 < uVar15) {
            uVar16 = uVar9;
            if (uVar9 < uVar13) {
              uVar16 = uVar13;
            }
            do {
              cVar2 = (this->m_Buffer)._M_dataplus._M_p[uVar13];
              uVar14 = uVar13;
              if (((cVar2 == '\r') || (cVar2 == ' ')) || (uVar14 = uVar16, uVar9 <= uVar13)) break;
              uVar13 = uVar13 + 1;
              uVar14 = uVar15;
            } while (uVar15 != uVar13);
          }
          local_c8 = local_b8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8);
          if (uVar14 < (this->m_Buffer)._M_string_length) {
            bVar17 = true;
            bVar6 = false;
            do {
              if ((ppVar18->second <= uVar14) || (!bVar17)) break;
              uVar13 = (ulong)(byte)(this->m_Buffer)._M_dataplus._M_p[uVar14];
              if ((uVar13 < 0x21) && ((0x100002400U >> (uVar13 & 0x3f) & 1) != 0)) {
                if (bVar6) {
                  bVar17 = false;
                }
                uVar14 = uVar14 - bVar6;
              }
              else {
                bVar17 = true;
                std::__cxx11::string::push_back((char)&local_c8);
                bVar6 = true;
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 < (this->m_Buffer)._M_string_length);
          }
          if ((local_c0 != (undefined1 *)0x0) &&
             ((local_c0 != (undefined1 *)local_100.line2 ||
              (iVar7 = bcmp(local_c8,(void *)local_100.line,(size_t)local_c0), iVar7 != 0)))) {
            std::__cxx11::string::_M_assign((string *)&local_100);
          }
          uVar13 = uVar14;
          if (local_c8 != local_b8) {
            operator_delete(local_c8);
          }
        }
        if ((unsigned_long *)local_100.line != &local_100.number) {
          operator_delete((void *)local_100.line);
        }
        ppVar18 = ppVar18 + 1;
      } while (ppVar18 !=
               (this->m_CommentPositions).
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  bVar12 = 1;
  if (checkMissingComment) {
    this->m_TestsDone[0x14] = true;
    std::__cxx11::string::_M_replace
              ((ulong)(this->m_TestsDescription + 0x14),0,
               (char *)this->m_TestsDescription[0x14]._M_string_length,0x178892);
    std::__cxx11::string::append((char *)(this->m_TestsDescription + 0x14));
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50);
    sVar8 = GetClassPosition(this,0,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    bVar12 = 1;
    if (sVar8 != 0xffffffffffffffff) {
      psVar1 = &this->m_Buffer;
      local_a0 = 0;
      do {
        local_98 = sVar8;
        sVar8 = GetPositionWithComments(this,sVar8);
        local_c8 = local_b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
        sVar4 = (this->m_CommentEnd)._M_string_length;
        if (sVar4 != 0) {
          pcVar5 = (this->m_CommentEnd)._M_dataplus._M_p;
          sVar19 = 0;
          do {
            if (pcVar5[sVar19] != ' ') {
              std::__cxx11::string::push_back((char)&local_c8);
            }
            sVar19 = sVar19 + 1;
          } while (sVar4 != sVar19);
        }
        uVar13 = std::__cxx11::string::find((char *)psVar1,(ulong)local_c8,0);
        uVar15 = uVar13;
        while (uVar9 = uVar13, uVar9 < sVar8) {
          uVar13 = std::__cxx11::string::find((char *)psVar1,(ulong)local_c8,uVar9 + 1);
          uVar15 = uVar9;
        }
        if (sVar8 < uVar15 || uVar15 == 0xffffffffffffffff) {
          local_100.description._M_dataplus._M_p = (pointer)&local_100.description.field_2;
          local_100.description._M_string_length = 0;
          local_100.description.field_2._M_local_buf[0] = '\0';
          local_100.line = GetLineNumber(this,sVar8,false);
          local_100.number = 0x14;
          local_100.line2 = local_100.line;
          std::__cxx11::string::_M_replace
                    ((ulong)&local_100.description,0,(char *)local_100.description._M_string_length,
                     0x17890b);
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                    (&this->m_ErrorList,&local_100);
LAB_0015450a:
          paVar11 = &local_100.description.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100.description._M_dataplus._M_p != paVar11) {
            operator_delete(local_100.description._M_dataplus._M_p);
            paVar11 = extraout_RAX;
          }
          local_a0 = CONCAT71((int7)((ulong)paVar11 >> 8),1);
        }
        else {
          if (uVar15 < sVar8) {
            bVar6 = true;
            uVar13 = uVar15;
            do {
              cVar2 = (psVar1->_M_dataplus)._M_p[uVar13];
              if (cVar2 == '\n') {
                if (!bVar6) {
                  if ((char)local_a4 != '\0') goto LAB_00154525;
                  local_100.description._M_dataplus._M_p = (pointer)&local_100.description.field_2;
                  local_100.description._M_string_length = 0;
                  local_100.description.field_2._M_local_buf[0] = '\0';
                  local_100.line = GetLineNumber(this,sVar8,false);
                  local_100.number = 0x14;
                  local_100.line2 = local_100.line;
                  std::__cxx11::string::_M_replace
                            ((ulong)&local_100.description,0,
                             (char *)local_100.description._M_string_length,0x17890b);
                  std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                            (&this->m_ErrorList,&local_100);
                  goto LAB_0015450a;
                }
                bVar6 = false;
              }
              bVar17 = true;
              if (cVar2 == ' ') {
                bVar17 = bVar6;
              }
              if (cVar2 == '\r') {
                bVar17 = bVar6;
              }
              if (cVar2 == '\n') {
                bVar17 = bVar6;
              }
              bVar6 = bVar17;
              uVar13 = uVar13 + 1;
            } while (sVar8 != uVar13);
          }
          uVar9 = std::__cxx11::string::find
                            ((char *)psVar1,(ulong)(this->m_CommentBegin)._M_dataplus._M_p,0);
          uVar13 = uVar9;
          while (uVar14 = uVar9, uVar14 < uVar15) {
            uVar9 = std::__cxx11::string::find
                              ((char *)psVar1,(ulong)(this->m_CommentBegin)._M_dataplus._M_p,
                               uVar14 + 1);
            uVar13 = uVar14;
          }
          if ((uVar13 != 0xffffffffffffffff) && (uVar15 != uVar13)) {
            std::__cxx11::string::substr((ulong)local_70,(ulong)psVar1);
            lVar10 = std::__cxx11::string::find((char *)local_70,0x178941,0);
            if (lVar10 == -1) {
              local_100.description._M_dataplus._M_p = (pointer)&local_100.description.field_2;
              local_100.description._M_string_length = 0;
              local_100.description.field_2._M_local_buf[0] = '\0';
              local_100.line = GetLineNumber(this,sVar8,false);
              local_100.number = 0x14;
              local_100.line2 = local_100.line;
              std::__cxx11::string::_M_replace
                        ((ulong)&local_100.description,0,
                         (char *)local_100.description._M_string_length,0x17892c);
              std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                        (&this->m_ErrorList,&local_100);
              paVar11 = &local_100.description.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100.description._M_dataplus._M_p != paVar11) {
                operator_delete(local_100.description._M_dataplus._M_p);
                paVar11 = extraout_RAX_00;
              }
              local_a0 = CONCAT71((int7)((ulong)paVar11 >> 8),1);
            }
            if (local_70[0] != local_60) {
              operator_delete(local_70[0]);
            }
          }
        }
LAB_00154525:
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
        sVar8 = GetClassPosition(this,local_98 + 1,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if (local_c8 != local_b8) {
          operator_delete(local_c8);
        }
      } while (sVar8 != 0xffffffffffffffff);
      bVar12 = (byte)local_a0 ^ 1;
    }
  }
  return (bool)(bVar12 & 1);
}

Assistant:

bool Parser::CheckComments(const char* begin,const char* middle,const char* end,
                           bool allowEmptyLineBeforeClass,
                           bool checkWrongComment,
                           bool checkMissingComment)
{
  bool hasError = false;
    
  if(checkWrongComment)
    {
    m_TestsDone[WRONGCOMMENT] = true;
    m_TestsDescription[WRONGCOMMENT] = "The comments are misspelled";
    
    // Set the ivars for the indent checking
    m_CommentBegin = begin;
    m_CommentMiddle = middle;
    m_CommentEnd = end;

    // We check if we have duplicate code in the comments
    std::vector<PairType>::const_iterator it = m_CommentPositions.begin();
    while(it != m_CommentPositions.end())
      {
      std::string previousWord = "";
      size_t i = (*it).first;
      while((i<m_Buffer.size()) && i<(*it).second)
        {    
        // we go to the next space
        while((i<m_Buffer.size()) && ((m_Buffer[i] != ' ') && (m_Buffer[i] != '\r') && (m_Buffer[i] != '\r')) && i<(*it).second)
          {
          i++;
          }
        bool inWord = true;
        bool first = false;
        std::string word = "";
        
        while((i<m_Buffer.size()) && i<(*it).second && inWord)
          {
          if(m_Buffer[i] != ' ' && m_Buffer[i] != '\r' && m_Buffer[i] != '\n')
            {
            word += m_Buffer[i];
            inWord = true;
            first = true;
            }
          else // we have a space
            {
            if(first)
              {
              inWord = false;
              i--;
              }
            }
          i++;
          }

          if (!word.empty()) {
            if (word != previousWord) {
              previousWord = word;
            }
          else if(previousWord.size() > 1 && 
               previousWord[0] != '/'
               && previousWord[0]<48 && previousWord[0]>57 // We check if the first word is not a number
               ) // avoid single char and comment
            {
            Error error;
            error.line = this->GetLineNumber(i,false);
            error.line2 = error.line;
            error.number = WRONGCOMMENT;
            error.description = "Duplicate word: ";
            error.description += previousWord;
            m_ErrorList.push_back(error);
            hasError = true;
            }
          }
        }
      it++;
      } // end buffer loop
    }

  if(checkMissingComment)
    {
    // Check if there is a comment before each class
    m_TestsDone[MISSINGCOMMENT] = true;
    m_TestsDescription[MISSINGCOMMENT] = "The class should have previously defined comments starting with \\class";

    if(allowEmptyLineBeforeClass)
      {
      m_TestsDescription[MISSINGCOMMENT] += " (allowing empty line)";
      }
    else
      {
      m_TestsDescription[MISSINGCOMMENT] += " (not allowing empty line)";
      }

   size_t pos = this->GetClassPosition(0);
   while(pos != std::string::npos)
     {
     size_t poswithcom = this->GetPositionWithComments(pos);

     // Find the last comment (remove spaces if any)
     std::string commentEnd = "";
     for (char j : m_CommentEnd) {
       if (j != ' ') {
         commentEnd += j;
       }
     }

     size_t poscom = m_Buffer.find(commentEnd,0);
     size_t poscomtemp = poscom;
     while(poscomtemp!=std::string::npos && poscomtemp<poswithcom)
       {
       poscom = poscomtemp;
       poscomtemp = m_Buffer.find(commentEnd,poscomtemp+1);
       }

     // if we don't have the comment
     if((poscom == std::string::npos) || (poscom > poswithcom))
       {
       Error error;
       error.line = this->GetLineNumber(poswithcom,false);
       error.line2 = error.line;
       error.number = MISSINGCOMMENT;
       error.description = "Comment is missing for the class";
       m_ErrorList.push_back(error);
       hasError = true;
       }
     else
       {
       // We check if we have m_CommentEnd before an empty line
       bool emptyLine = false;
       bool gotchar = true;
       for(size_t i=poscom;i<poswithcom;i++)
         {
         if(m_Buffer[i] == '\n')
           {
           if(!gotchar)
             {
             emptyLine = true;
             break;
             }
           gotchar = false;
           }

         if( (m_Buffer[i] != '\n') 
           && (m_Buffer[i] != '\r') 
           && (m_Buffer[i] != ' '))
           {
           gotchar = true;
           }   
         }

       if(emptyLine)
         {
         if(!allowEmptyLineBeforeClass)
           {
           Error error;
           error.line = this->GetLineNumber(poswithcom,false);
           error.line2 = error.line;
           error.number = MISSINGCOMMENT;
           error.description = "Comment is missing for the class";
           m_ErrorList.push_back(error);
           hasError = true;
           }
         }
       else  // we check that the word \class exists
         {
         // Find the last 
         size_t poscombeg = m_Buffer.find(m_CommentBegin,0);
         size_t poscombegt = poscombeg;
         while(poscombegt!=std::string::npos && poscombegt<poscom)
           {
           poscombeg = poscombegt;
           poscombegt = m_Buffer.find(m_CommentBegin,poscombegt+1);
           }

         if(poscombeg!=std::string::npos && (poscom-poscombeg>0))
           {
           std::string sub = m_Buffer.substr(poscombeg,poscom-poscombeg);
           if(sub.find("\\class") == std::string::npos)
             {
             Error error;
             error.line = this->GetLineNumber(poswithcom,false);
             error.line2 = error.line;
             error.number = MISSINGCOMMENT;
             error.description = "comment doesn't have \\class";
             m_ErrorList.push_back(error);
             hasError = true;
             }
           }
         }
       }
     pos = this->GetClassPosition(pos+1);
     }
   } // end check missing comments
  return !hasError;
}